

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFillBufferTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_0::FillBufferTestInstance::uploadBuffer
          (FillBufferTestInstance *this,ConstPixelBufferAccess *bufferAccess,Allocation *bufferAlloc
          )

{
  VkDevice device;
  VkDevice vkd;
  void *dst;
  void *src;
  VkDeviceMemory memory;
  VkDeviceSize offset;
  ConstPixelBufferAccess local_60;
  deUint32 local_34;
  VkDevice pVStack_30;
  deUint32 bufferSize;
  VkDevice vkDevice;
  DeviceInterface *vk;
  Allocation *bufferAlloc_local;
  ConstPixelBufferAccess *bufferAccess_local;
  FillBufferTestInstance *this_local;
  
  vk = (DeviceInterface *)bufferAlloc;
  bufferAlloc_local = (Allocation *)bufferAccess;
  bufferAccess_local = (ConstPixelBufferAccess *)this;
  vkDevice = (VkDevice)Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVStack_30 = Context::getDevice((this->super_TestInstance).m_context);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_60,bufferAccess);
  local_34 = calculateSize(this,&local_60);
  dst = ::vk::Allocation::getHostPtr((Allocation *)vk);
  src = tcu::ConstPixelBufferAccess::getDataPtr(bufferAccess);
  ::deMemcpy(dst,src,(ulong)local_34);
  vkd = vkDevice;
  device = pVStack_30;
  memory = ::vk::Allocation::getMemory((Allocation *)vk);
  offset = ::vk::Allocation::getOffset((Allocation *)vk);
  ::vk::flushMappedMemoryRange((DeviceInterface *)vkd,device,memory,offset,(ulong)local_34);
  return;
}

Assistant:

void FillBufferTestInstance::uploadBuffer (tcu::ConstPixelBufferAccess bufferAccess, const Allocation& bufferAlloc)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const deUint32				bufferSize	= calculateSize(bufferAccess);

	// Write buffer data
	deMemcpy(bufferAlloc.getHostPtr(), bufferAccess.getDataPtr(), bufferSize);
	flushMappedMemoryRange(vk, vkDevice, bufferAlloc.getMemory(), bufferAlloc.getOffset(), bufferSize);
}